

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2Match(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int port;
  string host;
  string all;
  StringPiece group [4];
  RE2 re;
  int local_32c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  StringPiece local_2e8;
  StringPiece local_2d8;
  StringPiece local_2c8;
  StringPiece local_2b8;
  int *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  StringPiece local_288;
  LogMessage local_278;
  RE2 local_f8;
  
  RE2::RE2(&local_f8,"((\\w+):([0-9]+))");
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&local_2e8.ptr_ + lVar3) = 0;
    *(undefined4 *)((long)&local_2e8.length_ + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  local_288.ptr_ = "zyzzyva";
  local_288.length_ = 7;
  bVar1 = RE2::Match(&local_f8,&local_288,0,7,UNANCHORED,&local_2e8,4);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x15f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_278 + 8),
               "Check failed: !re.Match(s, 0, s.size(), RE2::UNANCHORED, group, arraysize(group))",
               0x51);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_278);
  }
  local_288.ptr_ = "a chrisr:9000 here";
  local_288.length_ = 0x12;
  bVar1 = RE2::Match(&local_f8,&local_288,0,0x12,UNANCHORED,&local_2e8,4);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x164,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_278 + 8),
               "Check failed: re.Match(s, 0, s.size(), RE2::UNANCHORED, group, arraysize(group))",
               0x50);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_278);
  }
  local_278._0_8_ = "chrisr:9000";
  local_278._8_4_ = 0xb;
  bVar1 = StringPiece::_equal(&local_2e8,(StringPiece *)&local_278);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x165,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_278 + 8),"Check failed: (group[0]) == (\"chrisr:9000\")",
               0x2b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_278);
  }
  local_278._0_8_ = "chrisr:9000";
  local_278._8_4_ = 0xb;
  bVar1 = StringPiece::_equal(&local_2d8,(StringPiece *)&local_278);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x166,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_278 + 8),"Check failed: (group[1]) == (\"chrisr:9000\")",
               0x2b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_278);
  }
  local_278._0_8_ = "chrisr";
  local_278._8_4_ = 6;
  bVar1 = StringPiece::_equal(&local_2c8,(StringPiece *)&local_278);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x167,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_278 + 8),"Check failed: (group[2]) == (\"chrisr\")",0x26);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_278);
  }
  local_278._0_8_ = "9000";
  local_278._8_4_ = 4;
  bVar1 = StringPiece::_equal(&local_2b8,(StringPiece *)&local_278);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x168,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_278 + 8),"Check failed: (group[3]) == (\"9000\")",0x24);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_278);
  }
  local_308._M_string_length = 0;
  local_308.field_2._M_local_buf[0] = '\0';
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  local_278._0_8_ = "a chrisr:9000 here";
  local_278._8_4_ = 0x12;
  local_290 = &local_308;
  local_298 = &local_328;
  local_2a0 = &local_32c;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,int*>
                    ((StringPiece *)&local_278,&local_f8,&local_290,&local_298,&local_2a0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_278 + 8),
               "Check failed: RE2::PartialMatch(\"a chrisr:9000 here\", re, &all, &host, &port)",
               0x4d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_278);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_308);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_278 + 8),"Check failed: (all) == (\"chrisr:9000\")",0x26);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_278);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_328);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_278 + 8),"Check failed: (host) == (\"chrisr\")",0x22);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_278);
  }
  if (local_32c != 9000) {
    LogMessage::LogMessage
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_278 + 8),"Check failed: (port) == (9000)",0x1e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_278);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  RE2::~RE2(&local_f8);
  return;
}

Assistant:

TEST(RE2, Match) {
  RE2 re("((\\w+):([0-9]+))");   // extracts host and port
  StringPiece group[4];

  // No match.
  StringPiece s = "zyzzyva";
  CHECK(!re.Match(s, 0, s.size(), RE2::UNANCHORED,
                  group, arraysize(group)));

  // Matches and extracts.
  s = "a chrisr:9000 here";
  CHECK(re.Match(s, 0, s.size(), RE2::UNANCHORED,
                 group, arraysize(group)));
  CHECK_EQ(group[0], "chrisr:9000");
  CHECK_EQ(group[1], "chrisr:9000");
  CHECK_EQ(group[2], "chrisr");
  CHECK_EQ(group[3], "9000");

  string all, host;
  int port;
  CHECK(RE2::PartialMatch("a chrisr:9000 here", re, &all, &host, &port));
  CHECK_EQ(all, "chrisr:9000");
  CHECK_EQ(host, "chrisr");
  CHECK_EQ(port, 9000);
}